

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O2

void __thiscall
leveldb::InternalKeyComparator::FindShortSuccessor(InternalKeyComparator *this,string *key)

{
  ulong uVar1;
  int iVar2;
  Slice user_key;
  string tmp;
  pointer local_60;
  ulong local_58;
  string local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_30;
  ulong local_28;
  
  local_60 = (key->_M_dataplus)._M_p;
  uVar1 = key->_M_string_length - 8;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_58 = uVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,local_60,local_60 + (key->_M_string_length - 8));
  (*this->user_comparator_->_vptr_Comparator[5])(this->user_comparator_,&local_50);
  if (local_50._M_string_length < uVar1) {
    local_30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_50._M_dataplus._M_p;
    local_28 = local_50._M_string_length;
    iVar2 = (*this->user_comparator_->_vptr_Comparator[2])(this->user_comparator_,&local_60);
    if (iVar2 < 0) {
      PutFixed64(&local_50,0xffffffffffffff01);
      std::__cxx11::string::swap((string *)key);
    }
  }
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void InternalKeyComparator::FindShortSuccessor(std::string* key) const {
  Slice user_key = ExtractUserKey(*key);
  std::string tmp(user_key.data(), user_key.size());
  user_comparator_->FindShortSuccessor(&tmp);
  if (tmp.size() < user_key.size() &&
      user_comparator_->Compare(user_key, tmp) < 0) {
    // User key has become shorter physically, but larger logically.
    // Tack on the earliest possible number to the shortened user key.
    PutFixed64(&tmp,
               PackSequenceAndType(kMaxSequenceNumber, kValueTypeForSeek));
    assert(this->Compare(*key, tmp) < 0);
    key->swap(tmp);
  }
}